

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O2

void __thiscall
cppcms::url_dispatcher::assign<disp>
          (url_dispatcher *this,string *regex,member_type member,disp *object,int e1,int e2)

{
  undefined4 in_register_00000084;
  undefined4 in_stack_00000008;
  _Function_base local_60;
  undefined1 local_40 [16];
  disp *local_30;
  
  local_30 = (disp *)CONCAT44(in_register_00000084,e1);
  local_40._0_8_ = member;
  local_40._8_8_ = object;
  std::function<void(std::__cxx11::string,std::__cxx11::string)>::
  function<cppcms::url_dispatcher::binder2<disp>,void>
            ((function<void(std::__cxx11::string,std::__cxx11::string)> *)&local_60,
             (binder2<disp> *)local_40);
  cppcms::url_dispatcher::assign(this,regex,&local_60,e2,in_stack_00000008);
  std::_Function_base::~_Function_base(&local_60);
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(std::string,std::string),C *object,int e1,int e2)
		{
			assign(regex,binder2<C>(member,object),e1,e2);
		}